

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O2

void __thiscall RVO::Agent::computeNewVelocity(Agent *this)

{
  vector<RVO::Line,_std::allocator<RVO::Line>_> *lines;
  Vector2 VVar1;
  pointer pLVar2;
  pointer ppVar3;
  pointer pLVar4;
  pointer ppVar5;
  long lVar6;
  bool bVar7;
  float *pfVar8;
  size_t beginLine;
  long lVar9;
  Obstacle *pOVar10;
  ulong uVar11;
  Obstacle *pOVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  Line line;
  Vector2 local_b8;
  
  pLVar2 = (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
      super__Vector_impl_data._M_finish != pLVar2) {
    (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar2;
  }
  lines = &this->orcaLines_;
  fVar32 = 1.0 / this->timeHorizonObst_;
  uVar11 = 0;
  do {
    ppVar3 = (this->obstacleNeighbors_).
             super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->obstacleNeighbors_).
                      super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3 >> 4) <= uVar11) {
      pLVar2 = (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pLVar4 = (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar32 = 1.0 / this->timeHorizon_;
      lVar9 = 8;
      for (uVar11 = 0;
          ppVar5 = (this->agentNeighbors_).
                   super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar11 < (ulong)((long)(this->agentNeighbors_).
                                 super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >> 4);
          uVar11 = uVar11 + 1) {
        lVar6 = *(long *)((long)&ppVar5->first + lVar9);
        fVar23 = (this->velocity_).x_;
        fVar29 = (this->velocity_).y_;
        fVar22 = (float)*(undefined8 *)(lVar6 + 0x60) - (this->position_).x_;
        fVar19 = (float)((ulong)*(undefined8 *)(lVar6 + 0x60) >> 0x20) - (this->position_).y_;
        fVar24 = fVar23 - (float)*(undefined8 *)(lVar6 + 0x88);
        fVar14 = fVar29 - (float)((ulong)*(undefined8 *)(lVar6 + 0x88) >> 0x20);
        fVar15 = this->radius_ + *(float *)(lVar6 + 0x70);
        fVar20 = fVar22 * fVar22 + fVar19 * fVar19;
        line.direction.x_ = 0.0;
        line.direction.y_ = 0.0;
        fVar16 = fVar15 * fVar15;
        if (fVar20 <= fVar16) {
          fVar16 = 1.0 / this->sim_->timeStep_;
          fVar24 = fVar24 - fVar22 * fVar16;
          fVar14 = fVar14 - fVar19 * fVar16;
          fVar28 = SQRT(fVar24 * fVar24 + fVar14 * fVar14);
          fVar22 = 1.0 / fVar28;
          fVar24 = fVar22 * fVar24;
          fVar22 = fVar22 * fVar14;
          fVar28 = fVar15 * fVar16 - fVar28;
          fVar25 = fVar28 * fVar24;
          fVar28 = fVar28 * fVar22;
          line.direction = (Vector2)(CONCAT44(fVar24,fVar22) ^ 0x8000000000000000);
        }
        else {
          fVar25 = fVar24 - fVar32 * fVar22;
          fVar18 = fVar14 - fVar32 * fVar19;
          fVar31 = fVar25 * fVar22 + fVar19 * fVar18;
          if ((0.0 <= fVar31) ||
             (fVar28 = fVar25 * fVar25 + fVar18 * fVar18, fVar31 * fVar31 <= fVar16 * fVar28)) {
            fVar16 = fVar20 - fVar16;
            if (fVar16 < 0.0) {
              fVar16 = sqrtf(fVar16);
            }
            else {
              fVar16 = SQRT(fVar16);
            }
            if (fVar18 * fVar22 - fVar25 * fVar19 <= 0.0) {
              fVar23 = -(fVar15 * -fVar22 + fVar19 * fVar16);
              fVar16 = -(fVar16 * fVar22 + fVar19 * fVar15);
            }
            else {
              fVar23 = fVar22 * fVar15 + fVar16 * fVar19;
              fVar16 = fVar22 * fVar16 + -fVar19 * fVar15;
            }
            fVar23 = (1.0 / fVar20) * fVar23;
            fVar16 = (1.0 / fVar20) * fVar16;
            line.direction.y_ = fVar23;
            line.direction.x_ = fVar16;
            fVar29 = fVar16 * fVar24 + fVar14 * fVar23;
            fVar25 = fVar29 * fVar16 - fVar24;
            fVar28 = fVar29 * fVar23 - fVar14;
            fVar23 = (this->velocity_).x_;
            fVar29 = (this->velocity_).y_;
          }
          else {
            fVar28 = SQRT(fVar28);
            fVar16 = 1.0 / fVar28;
            fVar28 = fVar15 * fVar32 - fVar28;
            fVar25 = fVar25 * fVar16;
            fVar18 = fVar18 * fVar16;
            line.direction = (Vector2)(CONCAT44(fVar25,fVar18) ^ 0x8000000000000000);
            fVar25 = fVar28 * fVar25;
            fVar28 = fVar28 * fVar18;
          }
        }
        line.point.y_ = fVar28 * 0.5 + fVar29;
        line.point.x_ = fVar25 * 0.5 + fVar23;
        std::vector<RVO::Line,_std::allocator<RVO::Line>_>::push_back(lines,&line);
        lVar9 = lVar9 + 0x10;
      }
      beginLine = linearProgram2(lines,this->maxSpeed_,&this->prefVelocity_,false,
                                 &this->newVelocity_);
      if (beginLine <
          (ulong)((long)(this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        linearProgram3(lines,(long)pLVar2 - (long)pLVar4 >> 4,beginLine,this->maxSpeed_,
                       &this->newVelocity_);
      }
      return;
    }
    pOVar12 = ppVar3[uVar11].second;
    pOVar10 = pOVar12->nextObstacle_;
    fVar16 = (pOVar12->point_).x_;
    fVar23 = (this->position_).x_;
    fVar19 = fVar16 - fVar23;
    fVar29 = (pOVar12->point_).y_;
    fVar24 = (this->position_).y_;
    fVar20 = fVar29 - fVar24;
    fVar15 = (pOVar10->point_).x_;
    fVar14 = (pOVar10->point_).y_;
    fVar23 = fVar15 - fVar23;
    fVar24 = fVar14 - fVar24;
    pLVar2 = (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)(this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pLVar2 >> 4;
    fVar22 = this->radius_;
    pfVar8 = &(pLVar2->direction).y_;
    while (bVar13 = lVar9 != 0, lVar9 = lVar9 + -1, bVar13) {
      if ((-1e-05 <= ((fVar32 * fVar19 - pfVar8[-3]) * *pfVar8 -
                     (fVar32 * fVar20 - pfVar8[-2]) * ((Vector2 *)(pfVar8 + -1))->x_) +
                     -fVar32 * fVar22) &&
         (-1e-05 <= -fVar32 * fVar22 +
                    ((fVar32 * fVar23 - pfVar8[-3]) * *pfVar8 -
                    ((Vector2 *)(pfVar8 + -1))->x_ * (fVar32 * fVar24 - pfVar8[-2]))))
      goto LAB_00109716;
      pfVar8 = pfVar8 + 4;
    }
    fVar25 = fVar19 * fVar19 + fVar20 * fVar20;
    fVar28 = fVar22 * fVar22;
    fVar15 = fVar15 - fVar16;
    fVar14 = fVar14 - fVar29;
    fVar31 = -fVar19;
    fVar29 = -fVar20;
    fVar16 = (fVar31 * fVar15 - fVar14 * fVar20) / (fVar15 * fVar15 + fVar14 * fVar14);
    line.point.x_ = 0.0;
    line.point.y_ = 0.0;
    line.direction.x_ = 0.0;
    line.direction.y_ = 0.0;
    if ((fVar16 < 0.0) && (fVar25 <= fVar28)) {
      if (pOVar12->isConvex_ == true) {
        line.direction.y_ = fVar19 * (1.0 / SQRT(fVar25));
        line.direction.x_ = fVar29 * (1.0 / SQRT(fVar25));
        goto LAB_00109705;
      }
      goto LAB_00109716;
    }
    fVar18 = fVar23 * fVar23 + fVar24 * fVar24;
    if ((fVar16 <= 1.0) || (fVar28 < fVar18)) {
      fVar17 = fVar31 - fVar15 * fVar16;
      fVar15 = fVar29 - fVar14 * fVar16;
      fVar15 = fVar17 * fVar17 + fVar15 * fVar15;
      if (((0.0 <= fVar16) && (fVar16 < 1.0)) && (fVar15 <= fVar28)) {
        line.direction = (Vector2)((ulong)pOVar12->unitDir_ ^ 0x8000000080000000);
        goto LAB_00109705;
      }
      if ((0.0 <= fVar16) || (fVar28 < fVar15)) {
        if ((fVar16 <= 1.0) || (fVar28 < fVar15)) {
          if (pOVar12->isConvex_ == true) {
            fVar16 = fVar25 - fVar28;
            if (fVar16 < 0.0) {
              fVar16 = sqrtf(fVar16);
            }
            else {
              fVar16 = SQRT(fVar16);
            }
            fVar22 = this->radius_;
            local_b8.x_ = (1.0 / fVar25) * (fVar16 * fVar19 + fVar22 * fVar29);
            local_b8.y_ = (1.0 / fVar25) * (fVar22 * fVar19 + fVar20 * fVar16);
          }
          else {
            local_b8.x_ = -(pOVar12->unitDir_).x_;
            local_b8.y_ = -(pOVar12->unitDir_).y_;
          }
          if (pOVar10->isConvex_ == true) {
            fVar28 = fVar18 - fVar28;
            if (fVar28 < 0.0) {
              fVar28 = sqrtf(fVar28);
            }
            else {
              fVar28 = SQRT(fVar28);
            }
            fVar22 = this->radius_;
            fVar16 = (1.0 / fVar18) * (fVar28 * fVar23 + fVar24 * fVar22);
            fVar25 = (1.0 / fVar18) * (fVar22 * -fVar23 + fVar24 * fVar28);
          }
          else {
            fVar16 = (pOVar12->unitDir_).x_;
            fVar25 = (pOVar12->unitDir_).y_;
          }
        }
        else {
          if (pOVar10->isConvex_ != true) goto LAB_00109716;
          fVar28 = fVar18 - fVar28;
          if (fVar28 < 0.0) {
            fVar28 = sqrtf(fVar28);
          }
          else {
            fVar28 = SQRT(fVar28);
          }
          fVar22 = this->radius_;
          fVar18 = 1.0 / fVar18;
          local_b8.x_ = (-fVar24 * fVar22 + fVar28 * fVar23) * fVar18;
          local_b8.y_ = (fVar24 * fVar28 + fVar22 * fVar23) * fVar18;
          fVar16 = (fVar28 * fVar23 + fVar24 * fVar22) * fVar18;
          fVar25 = (fVar22 * -fVar23 + fVar24 * fVar28) * fVar18;
          pOVar12 = pOVar10;
        }
      }
      else {
        if (pOVar12->isConvex_ != true) goto LAB_00109716;
        fVar28 = fVar25 - fVar28;
        if (fVar28 < 0.0) {
          fVar28 = sqrtf(fVar28);
        }
        else {
          fVar28 = SQRT(fVar28);
        }
        fVar22 = this->radius_;
        fVar25 = 1.0 / fVar25;
        local_b8.x_ = (fVar22 * fVar29 + fVar28 * fVar19) * fVar25;
        local_b8.y_ = (fVar20 * fVar28 + fVar22 * fVar19) * fVar25;
        fVar16 = (fVar28 * fVar19 + fVar20 * fVar22) * fVar25;
        fVar25 = (fVar22 * fVar31 + fVar20 * fVar28) * fVar25;
        pOVar10 = pOVar12;
      }
      if (pOVar12->isConvex_ == true) {
        fVar23 = (pOVar12->prevObstacle_->unitDir_).x_;
        fVar29 = (pOVar12->prevObstacle_->unitDir_).y_;
        if (local_b8.y_ * fVar23 - local_b8.x_ * fVar29 < 0.0) goto LAB_00109549;
        local_b8.y_ = -fVar29;
        local_b8.x_ = -fVar23;
        bVar13 = true;
      }
      else {
LAB_00109549:
        bVar13 = false;
      }
      if ((pOVar10->isConvex_ != true) ||
         (0.0 < (pOVar10->unitDir_).y_ * fVar16 - fVar25 * (pOVar10->unitDir_).x_)) {
        bVar7 = false;
      }
      else {
        fVar16 = (pOVar10->unitDir_).x_;
        fVar25 = (pOVar10->unitDir_).y_;
        bVar7 = true;
      }
      fVar24 = (this->position_).x_;
      fVar15 = (this->position_).y_;
      fVar19 = (this->velocity_).x_;
      fVar31 = (this->velocity_).y_;
      fVar23 = ((pOVar12->point_).x_ - fVar24) * fVar32;
      fVar29 = ((pOVar12->point_).y_ - fVar15) * fVar32;
      fVar24 = ((pOVar10->point_).x_ - fVar24) * fVar32;
      fVar14 = ((pOVar10->point_).y_ - fVar15) * fVar32;
      fVar20 = fVar24 - fVar23;
      fVar28 = fVar14 - fVar29;
      fVar15 = fVar19 - fVar23;
      fVar18 = fVar31 - fVar29;
      fVar17 = 0.5;
      if (pOVar12 != pOVar10) {
        fVar17 = (fVar15 * fVar20 + fVar28 * fVar18) / (fVar20 * fVar20 + fVar28 * fVar28);
      }
      fVar30 = fVar15 * local_b8.x_ + local_b8.y_ * fVar18;
      if ((fVar17 < 0.0) && (fVar30 < 0.0)) {
LAB_001096ad:
        fVar16 = 1.0 / SQRT(fVar15 * fVar15 + fVar18 * fVar18);
        fVar15 = fVar16 * fVar15;
        fVar16 = fVar16 * fVar18;
        line.direction = (Vector2)(CONCAT44(fVar15,fVar16) ^ 0x8000000000000000);
        line.point.y_ = fVar29 + fVar22 * fVar32 * fVar16;
        line.point.x_ = fVar23 + fVar22 * fVar32 * fVar15;
        goto LAB_00109705;
      }
      fVar26 = fVar19 - fVar24;
      fVar27 = fVar31 - fVar14;
      fVar21 = fVar26 * fVar16 + fVar25 * fVar27;
      if ((fVar21 < 0.0) && ((pOVar12 == pOVar10 && (fVar30 < 0.0)))) goto LAB_001096ad;
      if ((1.0 < fVar17) && (fVar21 < 0.0)) {
        fVar16 = 1.0 / SQRT(fVar26 * fVar26 + fVar27 * fVar27);
        fVar26 = fVar16 * fVar26;
        fVar16 = fVar16 * fVar27;
        line.direction = (Vector2)(CONCAT44(fVar26,fVar16) ^ 0x8000000000000000);
        line.point.y_ = fVar14 + fVar22 * fVar32 * fVar16;
        line.point.x_ = fVar24 + fVar22 * fVar32 * fVar26;
        goto LAB_00109705;
      }
      fVar15 = INFINITY;
      if (((pOVar12 != pOVar10) && (fVar15 = INFINITY, 0.0 <= fVar17)) &&
         (fVar15 = INFINITY, fVar17 <= 1.0)) {
        fVar20 = fVar19 - (fVar20 * fVar17 + fVar23);
        fVar15 = fVar31 - (fVar28 * fVar17 + fVar29);
        fVar15 = fVar20 * fVar20 + fVar15 * fVar15;
      }
      fVar20 = INFINITY;
      if (0.0 <= fVar30) {
        fVar28 = fVar19 - (local_b8.x_ * fVar30 + fVar23);
        fVar20 = fVar31 - (fVar29 + local_b8.y_ * fVar30);
        fVar20 = fVar28 * fVar28 + fVar20 * fVar20;
      }
      fVar28 = INFINITY;
      if (0.0 <= fVar21) {
        fVar19 = fVar19 - (fVar16 * fVar21 + fVar24);
        fVar31 = fVar31 - (fVar25 * fVar21 + fVar14);
        fVar28 = fVar19 * fVar19 + fVar31 * fVar31;
      }
      if ((fVar15 <= fVar20) && (fVar15 <= fVar28)) {
        VVar1 = pOVar12->unitDir_;
        line.point.y_ = fVar29 - VVar1.x_ * fVar22 * fVar32;
        line.point.x_ = fVar23 + VVar1.y_ * fVar22 * fVar32;
        line.direction = (Vector2)((ulong)VVar1 ^ 0x8000000080000000);
        goto LAB_00109705;
      }
      if (fVar20 <= fVar28) {
        if (!bVar13) {
          line.point.y_ = local_b8.x_ * fVar22 * fVar32 + fVar29;
          line.point.x_ = fVar23 - local_b8.y_ * fVar22 * fVar32;
          line.direction = local_b8;
          goto LAB_00109705;
        }
      }
      else if (!bVar7) {
        line.point.y_ = fVar14 - fVar16 * fVar22 * fVar32;
        line.point.x_ = fVar24 + fVar25 * fVar22 * fVar32;
        line.direction = (Vector2)(CONCAT44(fVar25,fVar16) ^ 0x8000000080000000);
        goto LAB_00109705;
      }
    }
    else {
      if ((pOVar10->isConvex_ != true) ||
         ((pOVar10->unitDir_).y_ * fVar23 - (pOVar10->unitDir_).x_ * fVar24 < 0.0))
      goto LAB_00109716;
      line.direction.y_ = fVar23 * (1.0 / SQRT(fVar18));
      line.direction.x_ = -fVar24 * (1.0 / SQRT(fVar18));
LAB_00109705:
      std::vector<RVO::Line,_std::allocator<RVO::Line>_>::push_back(lines,&line);
    }
LAB_00109716:
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void Agent::computeNewVelocity()
	{
		orcaLines_.clear();

		const float invTimeHorizonObst = 1.0f / timeHorizonObst_;

		/* Create obstacle ORCA lines. */
		for (size_t i = 0; i < obstacleNeighbors_.size(); ++i) {

			const Obstacle *obstacle1 = obstacleNeighbors_[i].second;
			const Obstacle *obstacle2 = obstacle1->nextObstacle_;

			const Vector2 relativePosition1 = obstacle1->point_ - position_;
			const Vector2 relativePosition2 = obstacle2->point_ - position_;

			/*
			 * Check if velocity obstacle of obstacle is already taken care of by
			 * previously constructed obstacle ORCA lines.
			 */
			bool alreadyCovered = false;

			for (size_t j = 0; j < orcaLines_.size(); ++j) {
				if (det(invTimeHorizonObst * relativePosition1 - orcaLines_[j].point, orcaLines_[j].direction) - invTimeHorizonObst * radius_ >= -RVO_EPSILON && det(invTimeHorizonObst * relativePosition2 - orcaLines_[j].point, orcaLines_[j].direction) - invTimeHorizonObst * radius_ >=  -RVO_EPSILON) {
					alreadyCovered = true;
					break;
				}
			}

			if (alreadyCovered) {
				continue;
			}

			/* Not yet covered. Check for collisions. */

			const float distSq1 = absSq(relativePosition1);
			const float distSq2 = absSq(relativePosition2);

			const float radiusSq = sqr(radius_);

			const Vector2 obstacleVector = obstacle2->point_ - obstacle1->point_;
			const float s = (-relativePosition1 * obstacleVector) / absSq(obstacleVector);
			const float distSqLine = absSq(-relativePosition1 - s * obstacleVector);

			Line line;

			if (s < 0.0f && distSq1 <= radiusSq) {
				/* Collision with left vertex. Ignore if non-convex. */
				if (obstacle1->isConvex_) {
					line.point = Vector2(0.0f, 0.0f);
					line.direction = normalize(Vector2(-relativePosition1.y(), relativePosition1.x()));
					orcaLines_.push_back(line);
				}

				continue;
			}
			else if (s > 1.0f && distSq2 <= radiusSq) {
				/* Collision with right vertex. Ignore if non-convex
				 * or if it will be taken care of by neighoring obstace */
				if (obstacle2->isConvex_ && det(relativePosition2, obstacle2->unitDir_) >= 0.0f) {
					line.point = Vector2(0.0f, 0.0f);
					line.direction = normalize(Vector2(-relativePosition2.y(), relativePosition2.x()));
					orcaLines_.push_back(line);
				}

				continue;
			}
			else if (s >= 0.0f && s < 1.0f && distSqLine <= radiusSq) {
				/* Collision with obstacle segment. */
				line.point = Vector2(0.0f, 0.0f);
				line.direction = -obstacle1->unitDir_;
				orcaLines_.push_back(line);
				continue;
			}

			/*
			 * No collision.
			 * Compute legs. When obliquely viewed, both legs can come from a single
			 * vertex. Legs extend cut-off line when nonconvex vertex.
			 */

			Vector2 leftLegDirection, rightLegDirection;

			if (s < 0.0f && distSqLine <= radiusSq) {
				/*
				 * Obstacle viewed obliquely so that left vertex
				 * defines velocity obstacle.
				 */
				if (!obstacle1->isConvex_) {
					/* Ignore obstacle. */
					continue;
				}

				obstacle2 = obstacle1;

				const float leg1 = std::sqrt(distSq1 - radiusSq);
				leftLegDirection = Vector2(relativePosition1.x() * leg1 - relativePosition1.y() * radius_, relativePosition1.x() * radius_ + relativePosition1.y() * leg1) / distSq1;
				rightLegDirection = Vector2(relativePosition1.x() * leg1 + relativePosition1.y() * radius_, -relativePosition1.x() * radius_ + relativePosition1.y() * leg1) / distSq1;
			}
			else if (s > 1.0f && distSqLine <= radiusSq) {
				/*
				 * Obstacle viewed obliquely so that
				 * right vertex defines velocity obstacle.
				 */
				if (!obstacle2->isConvex_) {
					/* Ignore obstacle. */
					continue;
				}

				obstacle1 = obstacle2;

				const float leg2 = std::sqrt(distSq2 - radiusSq);
				leftLegDirection = Vector2(relativePosition2.x() * leg2 - relativePosition2.y() * radius_, relativePosition2.x() * radius_ + relativePosition2.y() * leg2) / distSq2;
				rightLegDirection = Vector2(relativePosition2.x() * leg2 + relativePosition2.y() * radius_, -relativePosition2.x() * radius_ + relativePosition2.y() * leg2) / distSq2;
			}
			else {
				/* Usual situation. */
				if (obstacle1->isConvex_) {
					const float leg1 = std::sqrt(distSq1 - radiusSq);
					leftLegDirection = Vector2(relativePosition1.x() * leg1 - relativePosition1.y() * radius_, relativePosition1.x() * radius_ + relativePosition1.y() * leg1) / distSq1;
				}
				else {
					/* Left vertex non-convex; left leg extends cut-off line. */
					leftLegDirection = -obstacle1->unitDir_;
				}

				if (obstacle2->isConvex_) {
					const float leg2 = std::sqrt(distSq2 - radiusSq);
					rightLegDirection = Vector2(relativePosition2.x() * leg2 + relativePosition2.y() * radius_, -relativePosition2.x() * radius_ + relativePosition2.y() * leg2) / distSq2;
				}
				else {
					/* Right vertex non-convex; right leg extends cut-off line. */
					rightLegDirection = obstacle1->unitDir_;
				}
			}

			/*
			 * Legs can never point into neighboring edge when convex vertex,
			 * take cutoff-line of neighboring edge instead. If velocity projected on
			 * "foreign" leg, no constraint is added.
			 */

			const Obstacle *const leftNeighbor = obstacle1->prevObstacle_;

			bool isLeftLegForeign = false;
			bool isRightLegForeign = false;

			if (obstacle1->isConvex_ && det(leftLegDirection, -leftNeighbor->unitDir_) >= 0.0f) {
				/* Left leg points into obstacle. */
				leftLegDirection = -leftNeighbor->unitDir_;
				isLeftLegForeign = true;
			}

			if (obstacle2->isConvex_ && det(rightLegDirection, obstacle2->unitDir_) <= 0.0f) {
				/* Right leg points into obstacle. */
				rightLegDirection = obstacle2->unitDir_;
				isRightLegForeign = true;
			}

			/* Compute cut-off centers. */
			const Vector2 leftCutoff = invTimeHorizonObst * (obstacle1->point_ - position_);
			const Vector2 rightCutoff = invTimeHorizonObst * (obstacle2->point_ - position_);
			const Vector2 cutoffVec = rightCutoff - leftCutoff;

			/* Project current velocity on velocity obstacle. */

			/* Check if current velocity is projected on cutoff circles. */
			const float t = (obstacle1 == obstacle2 ? 0.5f : ((velocity_ - leftCutoff) * cutoffVec) / absSq(cutoffVec));
			const float tLeft = ((velocity_ - leftCutoff) * leftLegDirection);
			const float tRight = ((velocity_ - rightCutoff) * rightLegDirection);

			if ((t < 0.0f && tLeft < 0.0f) || (obstacle1 == obstacle2 && tLeft < 0.0f && tRight < 0.0f)) {
				/* Project on left cut-off circle. */
				const Vector2 unitW = normalize(velocity_ - leftCutoff);

				line.direction = Vector2(unitW.y(), -unitW.x());
				line.point = leftCutoff + radius_ * invTimeHorizonObst * unitW;
				orcaLines_.push_back(line);
				continue;
			}
			else if (t > 1.0f && tRight < 0.0f) {
				/* Project on right cut-off circle. */
				const Vector2 unitW = normalize(velocity_ - rightCutoff);

				line.direction = Vector2(unitW.y(), -unitW.x());
				line.point = rightCutoff + radius_ * invTimeHorizonObst * unitW;
				orcaLines_.push_back(line);
				continue;
			}

			/*
			 * Project on left leg, right leg, or cut-off line, whichever is closest
			 * to velocity.
			 */
			const float distSqCutoff = ((t < 0.0f || t > 1.0f || obstacle1 == obstacle2) ? std::numeric_limits<float>::infinity() : absSq(velocity_ - (leftCutoff + t * cutoffVec)));
			const float distSqLeft = ((tLeft < 0.0f) ? std::numeric_limits<float>::infinity() : absSq(velocity_ - (leftCutoff + tLeft * leftLegDirection)));
			const float distSqRight = ((tRight < 0.0f) ? std::numeric_limits<float>::infinity() : absSq(velocity_ - (rightCutoff + tRight * rightLegDirection)));

			if (distSqCutoff <= distSqLeft && distSqCutoff <= distSqRight) {
				/* Project on cut-off line. */
				line.direction = -obstacle1->unitDir_;
				line.point = leftCutoff + radius_ * invTimeHorizonObst * Vector2(-line.direction.y(), line.direction.x());
				orcaLines_.push_back(line);
				continue;
			}
			else if (distSqLeft <= distSqRight) {
				/* Project on left leg. */
				if (isLeftLegForeign) {
					continue;
				}

				line.direction = leftLegDirection;
				line.point = leftCutoff + radius_ * invTimeHorizonObst * Vector2(-line.direction.y(), line.direction.x());
				orcaLines_.push_back(line);
				continue;
			}
			else {
				/* Project on right leg. */
				if (isRightLegForeign) {
					continue;
				}

				line.direction = -rightLegDirection;
				line.point = rightCutoff + radius_ * invTimeHorizonObst * Vector2(-line.direction.y(), line.direction.x());
				orcaLines_.push_back(line);
				continue;
			}
		}

		const size_t numObstLines = orcaLines_.size();

		const float invTimeHorizon = 1.0f / timeHorizon_;

		/* Create agent ORCA lines. */
		for (size_t i = 0; i < agentNeighbors_.size(); ++i) {
			const Agent *const other = agentNeighbors_[i].second;

			const Vector2 relativePosition = other->position_ - position_;
			const Vector2 relativeVelocity = velocity_ - other->velocity_;
			const float distSq = absSq(relativePosition);
			const float combinedRadius = radius_ + other->radius_;
			const float combinedRadiusSq = sqr(combinedRadius);

			Line line;
			Vector2 u;

			if (distSq > combinedRadiusSq) {
				/* No collision. */
				const Vector2 w = relativeVelocity - invTimeHorizon * relativePosition;
				/* Vector from cutoff center to relative velocity. */
				const float wLengthSq = absSq(w);

				const float dotProduct1 = w * relativePosition;

				if (dotProduct1 < 0.0f && sqr(dotProduct1) > combinedRadiusSq * wLengthSq) {
					/* Project on cut-off circle. */
					const float wLength = std::sqrt(wLengthSq);
					const Vector2 unitW = w / wLength;

					line.direction = Vector2(unitW.y(), -unitW.x());
					u = (combinedRadius * invTimeHorizon - wLength) * unitW;
				}
				else {
					/* Project on legs. */
					const float leg = std::sqrt(distSq - combinedRadiusSq);

					if (det(relativePosition, w) > 0.0f) {
						/* Project on left leg. */
						line.direction = Vector2(relativePosition.x() * leg - relativePosition.y() * combinedRadius, relativePosition.x() * combinedRadius + relativePosition.y() * leg) / distSq;
					}
					else {
						/* Project on right leg. */
						line.direction = -Vector2(relativePosition.x() * leg + relativePosition.y() * combinedRadius, -relativePosition.x() * combinedRadius + relativePosition.y() * leg) / distSq;
					}

					const float dotProduct2 = relativeVelocity * line.direction;

					u = dotProduct2 * line.direction - relativeVelocity;
				}
			}
			else {
				/* Collision. Project on cut-off circle of time timeStep. */
				const float invTimeStep = 1.0f / sim_->timeStep_;

				/* Vector from cutoff center to relative velocity. */
				const Vector2 w = relativeVelocity - invTimeStep * relativePosition;

				const float wLength = abs(w);
				const Vector2 unitW = w / wLength;

				line.direction = Vector2(unitW.y(), -unitW.x());
				u = (combinedRadius * invTimeStep - wLength) * unitW;
			}

			line.point = velocity_ + 0.5f * u;
			orcaLines_.push_back(line);
		}

		size_t lineFail = linearProgram2(orcaLines_, maxSpeed_, prefVelocity_, false, newVelocity_);

		if (lineFail < orcaLines_.size()) {
			linearProgram3(orcaLines_, numObstLines, lineFail, maxSpeed_, newVelocity_);
		}
	}